

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

string * __thiscall
cmStringSorter::ApplyFilter(string *__return_storage_ptr__,cmStringSorter *this,string *argument)

{
  pointer pcVar1;
  code *pcVar2;
  long lVar3;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (argument->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + argument->_M_string_length);
  lVar3 = 0;
  do {
    pcVar2 = *(code **)((long)this->filters + lVar3);
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)((string *)local_50,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x10);
  return __return_storage_ptr__;
}

Assistant:

std::string ApplyFilter(const std::string& argument)
  {
    std::string result = argument;
    for (auto filter : filters) {
      if (filter != nullptr) {
        result = filter(result);
      }
    }
    return result;
  }